

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265_stream.cpp
# Opt level: O2

void h265_free(h265_stream_t *h)

{
  int i;
  long lVar1;
  
  free(h->nal);
  for (lVar1 = 9; lVar1 != 0x19; lVar1 = lVar1 + 1) {
    free(h->vps_table[lVar1 + -9]);
  }
  for (lVar1 = 0x19; lVar1 != 0x39; lVar1 = lVar1 + 1) {
    free(h->vps_table[lVar1 + -9]);
  }
  for (lVar1 = 0x39; lVar1 != 0x139; lVar1 = lVar1 + 1) {
    free(h->vps_table[lVar1 + -9]);
  }
  free(h->aud);
  if (h->seis != (h265_sei_t **)0x0) {
    for (lVar1 = 0; lVar1 < h->num_seis; lVar1 = lVar1 + 1) {
      h265_sei_free(h->seis[lVar1]);
    }
    free(h->seis);
  }
  free(h->sh);
  free(h);
  return;
}

Assistant:

void h265_free(h265_stream_t* h)
{
    free(h->nal);
    for ( int i = 0; i < 16; i++ ) { if (h->vps_table[i]!=NULL) free( h->vps_table[i] ); }
    for ( int i = 0; i < 32; i++ ) { if (h->sps_table[i]!=NULL) free( h->sps_table[i] ); }
    for ( int i = 0; i < 256; i++ ) { if (h->pps_table[i]!=NULL) free( h->pps_table[i] ); }

    if (h->aud != NULL)
    {
        free(h->aud);
    }

    if(h->seis != NULL)
    {
        for( int i = 0; i < h->num_seis; i++ )
        {
            h265_sei_t* sei = h->seis[i];
            h265_sei_free(sei);
        }
        free(h->seis);
    }
    free(h->sh);
    free(h);
}